

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * Catch::StringMaker<char_const*,void>::convert_abi_cxx11_(char *str)

{
  StringRef string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  size_type in_stack_ffffffffffffffc8;
  allocator<char> local_21;
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  if (in_RSI == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    std::allocator<char>::~allocator(&local_21);
  }
  else {
    StringRef::StringRef((StringRef *)in_RDI,(char *)in_RDI);
    string.m_size = in_stack_ffffffffffffffc8;
    string.m_start = (char *)in_RDI;
    Detail::convertIntoString_abi_cxx11_(string);
  }
  return in_RDI;
}

Assistant:

std::string StringMaker<char const*>::convert(char const* str) {
    if (str) {
        return Detail::convertIntoString( str );
    } else {
        return{ "{null string}" };
    }
}